

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void kratos::merge_bundle_mapping
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>_>_>_>
                *old_mapping)

{
  pointer *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  string *port_name_00;
  type port_name_01;
  element_type *this_01;
  bool bVar1;
  bool bVar2;
  int iVar3;
  PortDirection PVar4;
  PortDirection PVar5;
  reference __in;
  type *this_02;
  type *this_03;
  size_type __n;
  reference __args;
  iterator __first;
  _Base_ptr format_str;
  void *key;
  uint64_t len;
  mapped_type *pmVar6;
  InternalException *pIVar7;
  element_type *peVar8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar9;
  bool *__args_2;
  reference ppVar10;
  type *port_name_02;
  type *ppGVar11;
  undefined4 extraout_var;
  element_type *peVar12;
  PortPackedStruct *this_04;
  reference ppVar13;
  type *ptVar14;
  element_type *peVar15;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aVar16;
  undefined1 auVar17 [16];
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  remove_reference_t<const_std::__cxx11::basic_string<char>_&> *in_stack_fffffffffffff8b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_700;
  allocator<char> local_5e1;
  string local_5e0;
  PackedSlice *local_5c0;
  PackedSlice *slice;
  shared_ptr<kratos::Port> target;
  type *real_name_1;
  type *attr;
  _Self local_590;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3_2;
  PortPackedStruct *packed;
  shared_ptr<kratos::Port> local_568;
  PortDirection local_554;
  element_type *peStack_550;
  PortDirection dir;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *m;
  shared_ptr<kratos::PortBundleRef> ref_1;
  Generator *p;
  type *generator_1;
  type *entry_name_1;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>_>
  local_518;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  type *__range2_3;
  shared_ptr<kratos::PackedStruct> struct_;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
  local_4e8;
  undefined1 local_4c0 [8];
  shared_ptr<kratos::Port> port_1;
  type *real_name;
  type *var_name;
  undefined1 local_498 [8];
  const_iterator __end2_2;
  const_iterator __begin2_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *mapping;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
  def;
  string local_458;
  undefined1 local_431;
  _Rb_tree_node_base local_430;
  undefined8 local_410;
  uint64_t hash_1;
  pair<kratos::Generator_*const,_unsigned_long> *iter_1;
  iterator __end2_1;
  iterator __begin2_1;
  map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
  *__range2_1;
  uint64_t base_hash;
  bool initialized;
  _Rb_tree_node_base local_3c0;
  _Self local_3a0;
  _Self local_398;
  _Base_ptr local_390;
  uint64_t hash;
  _Rb_tree_node_base local_380;
  undefined1 local_360 [8];
  shared_ptr<kratos::Port> port;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *port_name;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  string base_str;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *iter;
  iterator __end3;
  iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ports;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mappings;
  undefined1 local_288 [8];
  shared_ptr<kratos::PortBundleRef> ref;
  type *generator;
  type *entry_name;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>_>
  local_260;
  const_iterator __end2;
  const_iterator __begin2;
  type *__range2;
  Generator *ref_generator;
  shared_ptr<kratos::PortBundleRef> ref_port_ref;
  map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
  bundle_hashs;
  type *generators;
  type *bundle_name;
  _Self local_1e8;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>_>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>_>_>_>
  *old_mapping_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_1b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_unsigned_int,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8;
  _Base_ptr local_160;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_unsigned_int,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  _Base_ptr local_150;
  _Base_ptr local_148;
  __node_base local_140;
  _Base_ptr local_138;
  _Rb_tree_node_base *local_130;
  _Base_ptr local_128;
  Generator *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_118;
  __node_base local_108;
  undefined1 local_f8 [8];
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  __node_base local_e8;
  _Rb_tree_node_base *local_e0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_d8;
  basic_string_view<char> local_c8;
  __node_base local_b8;
  _Base_ptr local_a0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  Generator *local_90;
  _Rb_tree_node_base *local_88;
  __node_base local_80;
  Generator *local_78;
  __node_base local_70;
  __node_base local_68;
  __node_base local_60;
  _Base_ptr local_58;
  __node_base local_50;
  ModuleInstantiationStmt *local_48;
  pointer local_40;
  pointer local_38;
  __node_base local_30;
  ModuleInstantiationStmt *local_28;
  _Base_ptr local_20;
  __node_base local_18;
  __node_base local_10;
  
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>_>_>_>
           ::begin(old_mapping);
  local_1e8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>_>_>_>
       ::end(old_mapping);
  do {
    bVar1 = std::operator!=(&__end1,&local_1e8);
    if (!bVar1) {
      return;
    }
    __in = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>_>_>
           ::operator*(&__end1);
    this_02 = std::
              get<0ul,std::__cxx11::string_const,std::vector<std::pair<std::__cxx11::string,kratos::Generator*>,std::allocator<std::pair<std::__cxx11::string,kratos::Generator*>>>>
                        (__in);
    this_03 = std::
              get<1ul,std::__cxx11::string_const,std::vector<std::pair<std::__cxx11::string,kratos::Generator*>,std::allocator<std::pair<std::__cxx11::string,kratos::Generator*>>>>
                        (__in);
    std::
    map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
    ::map((map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
           *)&ref_port_ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
    std::shared_ptr<kratos::PortBundleRef>::shared_ptr
              ((shared_ptr<kratos::PortBundleRef> *)&ref_generator);
    __range2 = (type *)0x0;
    __end2 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>
             ::begin(this_03);
    local_260._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>
            ::end(this_03);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end2,&local_260);
      if (!bVar1) break;
      ppVar10 = __gnu_cxx::
                __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>_>
                ::operator*(&__end2);
      std::get<0ul,std::__cxx11::string,kratos::Generator*>(ppVar10);
      ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::get<1ul,std::__cxx11::string,kratos::Generator*>(ppVar10);
      Generator::get_bundle_ref
                ((Generator *)local_288,
                 (string *)
                 (ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_vptr__Sp_counted_base);
      peVar8 = std::
               __shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_288);
      pmVar9 = PortBundleRef::name_mappings_abi_cxx11_(peVar8);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&ports.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pmVar9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range3);
      __n = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&ports.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range3,__n);
      this = &ports.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __end3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)this);
      iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)this);
      while( true ) {
        bVar1 = std::operator!=(&__end3,(_Self *)&iter);
        if (!bVar1) break;
        __args = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(&__end3);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range3,
                   &__args->first);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&__end3);
      }
      __first = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range3);
      base_str.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range3);
      std::
      sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__first._M_current,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )base_str.field_2._8_8_);
      std::__cxx11::string::string((string *)&__range3_1);
      __end3_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range3);
      port_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range3);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3_1,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&port_name);
        if (!bVar1) break;
        port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end3_1);
        port_name_00 = (string *)
                       (ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_vptr__Sp_counted_base;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&ports.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (key_type *)
             port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        Generator::get_port((Generator *)local_360,port_name_00);
        peVar12 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_360);
        format_str = (_Base_ptr)Var::var_width(&peVar12->super_Var);
        peVar12 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_360);
        hash._4_4_ = (*(peVar12->super_Var).super_IRNode._vptr_IRNode[7])();
        peVar12 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_360);
        local_150 = (_Base_ptr)Var::is_signed(&peVar12->super_Var);
        local_130 = &local_380;
        local_138 = (_Base_ptr)0x42667c;
        local_148 = (_Base_ptr)((long)&hash + 4);
        vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_unsigned_int,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
        in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                 )port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        local_140._M_nxt = (_Hash_node_base *)format_str;
        fmt::v7::
        make_args_checked<unsigned_int&,unsigned_int,bool&,std::__cxx11::string_const&,char[13],char>
                  (&local_1a8,(v7 *)"{0}{1}{2}{3}",(char (*) [13])format_str,
                   (remove_reference_t<unsigned_int_&> *)local_148,
                   (remove_reference_t<unsigned_int> *)local_150,
                   (remove_reference_t<bool_&> *)
                   port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi,in_stack_fffffffffffff8b8);
        local_160 = (_Base_ptr)&local_1a8;
        aVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                  )fmt::v7::to_string_view<char,_0>((char *)local_138);
        local_78 = (Generator *)&old_mapping_local;
        local_80._M_nxt = (_Hash_node_base *)local_160;
        local_70._M_nxt = (_Hash_node_base *)local_160;
        local_60._M_nxt = (_Hash_node_base *)local_160;
        local_68._M_nxt = (_Hash_node_base *)local_78;
        local_1b8 = aVar16;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_78,0xd722,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_160);
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_1c0.values_;
        format_str_00.size_ = (size_t)old_mapping_local;
        format_str_00.data_ = (char *)local_1b8._8_8_;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)&local_380,(detail *)local_1b8._M_allocated_capacity,format_str_00,args
                  );
        std::__cxx11::string::append((string *)&__range3_1);
        std::__cxx11::string::~string((string *)&local_380);
        std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)local_360);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3_1);
      }
      key = (void *)std::__cxx11::string::c_str();
      len = std::__cxx11::string::size();
      local_390 = (_Base_ptr)hash_64_fnv1a(key,len);
      local_398._M_node =
           (_Base_ptr)
           std::
           map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
           ::find((map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
                   *)&ref_port_ref.
                      super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                  (key_type *)
                  ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi);
      local_3a0._M_node =
           (_Base_ptr)
           std::
           map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
           ::end((map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
                  *)&ref_port_ref.
                     super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
      bVar1 = std::operator!=(&local_398,&local_3a0);
      if (bVar1) {
        pmVar6 = std::
                 map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
                 ::at((map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
                       *)&ref_port_ref.
                          super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,
                      (key_type *)
                      ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
        if ((_Base_ptr)*pmVar6 != local_390) {
          auVar17 = __cxa_allocate_exception(0x10);
          local_88 = &local_3c0;
          local_90 = (Generator *)0x426689;
          vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this_02;
          local_b8._M_nxt =
               (_Hash_node_base *)
               fmt::v7::make_args_checked<std::__cxx11::string_const&,char[57],char>
                         ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)"Port bundle with same name {0} have different definition",
                          (v7 *)this_02,auVar17._8_8_,
                          (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                          "Port bundle with same name {0} have different definition");
          local_a0 = (_Base_ptr)&local_b8;
          local_c8 = fmt::v7::to_string_view<char,_0>((char *)local_90);
          local_50._M_nxt = (_Hash_node_base *)&local_d8;
          local_58 = local_a0;
          local_20 = local_a0;
          local_10._M_nxt = (_Hash_node_base *)local_a0;
          local_18._M_nxt = local_50._M_nxt;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_50._M_nxt,0xd,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_a0);
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_d8.field_1.values_;
          format_str_01.size_ = local_d8.desc_;
          format_str_01.data_ = (char *)local_c8.size_;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)&local_3c0,(detail *)local_c8.data_,format_str_01,args_00);
          UserException::UserException(auVar17._0_8_,(string *)&local_3c0);
          __cxa_throw(auVar17._0_8_,&UserException::typeinfo,UserException::~UserException);
        }
      }
      std::
      map<kratos::Generator*,unsigned_long,std::less<kratos::Generator*>,std::allocator<std::pair<kratos::Generator*const,unsigned_long>>>
      ::emplace<kratos::Generator*const&,unsigned_long&>
                ((map<kratos::Generator*,unsigned_long,std::less<kratos::Generator*>,std::allocator<std::pair<kratos::Generator*const,unsigned_long>>>
                  *)&ref_port_ref.
                     super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,
                 (Generator **)
                 ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi,(unsigned_long *)&local_390);
      __range2 = (type *)(ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_vptr__Sp_counted_base;
      std::shared_ptr<kratos::PortBundleRef>::operator=
                ((shared_ptr<kratos::PortBundleRef> *)&ref_generator,
                 (shared_ptr<kratos::PortBundleRef> *)local_288);
      std::__cxx11::string::~string((string *)&__range3_1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range3);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&ports.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::shared_ptr<kratos::PortBundleRef>::~shared_ptr
                ((shared_ptr<kratos::PortBundleRef> *)local_288);
      __gnu_cxx::
      __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>_>
      ::operator++(&__end2);
    }
    bVar1 = false;
    __range2_1 = (map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
                  *)0x0;
    this_00 = &ref_port_ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    __end2_1 = std::
               map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
               ::begin((map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
                        *)this_00);
    iter_1 = (pair<kratos::Generator_*const,_unsigned_long> *)
             std::
             map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
             ::end((map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
                    *)this_00);
    while( true ) {
      bVar2 = std::operator!=(&__end2_1,(_Self *)&iter_1);
      if (!bVar2) break;
      hash_1 = (uint64_t)
               std::_Rb_tree_iterator<std::pair<kratos::Generator_*const,_unsigned_long>_>::
               operator*(&__end2_1);
      local_410 = ((reference)hash_1)->second;
      if (bVar1) {
        if (__range2_1 !=
            (map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
             *)local_410) {
          local_431 = '\x01';
          auVar17 = __cxa_allocate_exception(0x10);
          local_e0 = &local_430;
          local_e8._M_nxt = (_Hash_node_base *)0x426689;
          vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this_02;
          local_108._M_nxt =
               (_Hash_node_base *)
               fmt::v7::make_args_checked<std::__cxx11::string_const&,char[57],char>
                         ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)"Port bundle with same name {0} have different definition",
                          (v7 *)this_02,auVar17._8_8_,
                          (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                          "Port bundle with same name {0} have different definition");
          local_f8 = (undefined1  [8])&local_108;
          local_118 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                       )fmt::v7::to_string_view<char,_0>((char *)local_e8._M_nxt);
          local_40 = (pointer)&local_128;
          local_48 = (ModuleInstantiationStmt *)local_f8;
          local_38 = (pointer)local_f8;
          local_28 = (ModuleInstantiationStmt *)local_f8;
          local_30._M_nxt = (_Hash_node_base *)local_40;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_40,0xd,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_f8);
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_120;
          format_str_02.size_ = (size_t)local_128;
          format_str_02.data_ = (char *)local_118._8_8_;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)&local_430,(detail *)local_118._M_allocated_capacity,format_str_02,
                     args_01);
          UserException::UserException(auVar17._0_8_,(string *)&local_430);
          local_431 = '\0';
          __cxa_throw(auVar17._0_8_,&UserException::typeinfo,UserException::~UserException);
        }
      }
      else {
        bVar1 = true;
        __range2_1 = (map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
                      *)local_410;
      }
      std::_Rb_tree_iterator<std::pair<kratos::Generator_*const,_unsigned_long>_>::operator++
                (&__end2_1);
    }
    if (__range2 == (type *)0x0) {
      def.
      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
      pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_458,"ref generator cannot be null",
                 (allocator<char> *)
                 ((long)&def.
                         super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      InternalException::InternalException(pIVar7,&local_458);
      def.
      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      __cxa_throw(pIVar7,&InternalException::typeinfo,InternalException::~InternalException);
    }
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
    ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
              *)&mapping);
    peVar8 = std::
             __shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&ref_generator);
    pmVar9 = PortBundleRef::name_mappings_abi_cxx11_(peVar8);
    __end2_2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(pmVar9);
    local_498 = (undefined1  [8])
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::end(pmVar9);
    while( true ) {
      bVar1 = std::operator!=(&__end2_2,(_Self *)local_498);
      if (!bVar1) break;
      ppVar13 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator*(&__end2_2);
      ptVar14 = std::get<0ul,std::__cxx11::string_const,std::__cxx11::string>(ppVar13);
      port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::get<1ul,std::__cxx11::string_const,std::__cxx11::string>(ppVar13);
      Generator::get_port((Generator *)local_4c0,(string *)__range2);
      peVar12 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_4c0);
      struct_.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ._4_4_ = (*(peVar12->super_Var).super_IRNode._vptr_IRNode[7])();
      peVar12 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_4c0);
      __args_2 = Var::is_signed(&peVar12->super_Var);
      std::make_tuple<std::__cxx11::string_const&,unsigned_int,bool&>
                (&local_4e8,ptVar14,
                 (uint *)((long)&struct_.
                                 super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 4),__args_2);
      std::
      vector<std::tuple<std::__cxx11::string,unsigned_int,bool>,std::allocator<std::tuple<std::__cxx11::string,unsigned_int,bool>>>
      ::emplace_back<std::tuple<std::__cxx11::string,unsigned_int,bool>>
                ((vector<std::tuple<std::__cxx11::string,unsigned_int,bool>,std::allocator<std::tuple<std::__cxx11::string,unsigned_int,bool>>>
                  *)&mapping,&local_4e8);
      std::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
      ::~tuple(&local_4e8);
      std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)local_4c0);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2_2);
    }
    std::
    make_shared<kratos::PackedStruct,std::__cxx11::string_const&,std::vector<std::tuple<std::__cxx11::string,unsigned_int,bool>,std::allocator<std::tuple<std::__cxx11::string,unsigned_int,bool>>>&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2_3,
               (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
                *)this_02);
    __end2_3 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>
               ::begin(this_03);
    local_518._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>
            ::end(this_03);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end2_3,&local_518);
      if (!bVar1) break;
      ppVar10 = __gnu_cxx::
                __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>_>
                ::operator*(&__end2_3);
      port_name_02 = std::get<0ul,std::__cxx11::string,kratos::Generator*>(ppVar10);
      ppGVar11 = std::get<1ul,std::__cxx11::string,kratos::Generator*>(ppVar10);
      iVar3 = (*((*ppGVar11)->super_IRNode)._vptr_IRNode[4])();
      if (CONCAT44(extraout_var,iVar3) == 0) {
        local_700 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_700 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    __dynamic_cast(CONCAT44(extraout_var,iVar3),&IRNode::typeinfo,
                                   &Generator::typeinfo,0);
      }
      ref_1.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = local_700;
      Generator::get_bundle_ref((Generator *)&m,(string *)*ppGVar11);
      peVar8 = std::
               __shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&m);
      peStack_550 = (element_type *)PortBundleRef::name_mappings_abi_cxx11_(peVar8);
      port_name_01 = *ppGVar11;
      packed = (PortPackedStruct *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)peStack_550);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&packed);
      Generator::get_port((Generator *)&local_568,(string *)port_name_01);
      peVar12 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_568);
      PVar4 = Port::port_direction(peVar12);
      std::shared_ptr<kratos::Port>::~shared_ptr(&local_568);
      local_554 = PVar4;
      this_04 = Generator::port_packed
                          (*ppGVar11,PVar4,port_name_02,
                           (shared_ptr<kratos::PackedStruct> *)&__range2_3);
      this_01 = peStack_550;
      __end3_2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)peStack_550);
      local_590._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this_01);
      while( true ) {
        bVar1 = std::operator!=(&__end3_2,&local_590);
        if (!bVar1) break;
        ppVar13 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator*(&__end3_2);
        ptVar14 = std::get<0ul,std::__cxx11::string_const,std::__cxx11::string>(ppVar13);
        target.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::get<1ul,std::__cxx11::string_const,std::__cxx11::string>(ppVar13);
        Generator::get_port((Generator *)&slice,(string *)*ppGVar11);
        local_5c0 = PortPackedStruct::operator[](this_04,ptVar14);
        PVar4 = local_554;
        peVar12 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&slice);
        PVar5 = Port::port_direction(peVar12);
        if (PVar4 != PVar5) {
          pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5e0,"Direction doesn\'t match",&local_5e1);
          InternalException::InternalException(pIVar7,&local_5e0);
          __cxa_throw(pIVar7,&InternalException::typeinfo,InternalException::~InternalException);
        }
        if (local_554 == In) {
          if (ref_1.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            peVar15 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                                ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)&slice);
            Var::move_src_to(&peVar15->super_Var,(Var *)local_5c0,
                             (Generator *)
                             ref_1.
                             super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi,false);
          }
          peVar15 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                              ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)&slice);
          Var::move_sink_to(&peVar15->super_Var,(Var *)local_5c0,*ppGVar11,false);
        }
        else {
          peVar15 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                              ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)&slice);
          Var::move_src_to(&peVar15->super_Var,(Var *)local_5c0,*ppGVar11,false);
          if (ref_1.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            peVar15 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                                ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)&slice);
            Var::move_sink_to(&peVar15->super_Var,(Var *)local_5c0,
                              (Generator *)
                              ref_1.
                              super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi,false);
          }
        }
        Generator::remove_port
                  (*ppGVar11,
                   (string *)
                   target.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
        std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)&slice);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&__end3_2);
      }
      Generator::remove_bundle_port_ref(*ppGVar11,port_name_02);
      std::shared_ptr<kratos::PortBundleRef>::~shared_ptr((shared_ptr<kratos::PortBundleRef> *)&m);
      __gnu_cxx::
      __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>_>
      ::operator++(&__end2_3);
    }
    std::shared_ptr<kratos::PackedStruct>::~shared_ptr
              ((shared_ptr<kratos::PackedStruct> *)&__range2_3);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
    ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
               *)&mapping);
    std::shared_ptr<kratos::PortBundleRef>::~shared_ptr
              ((shared_ptr<kratos::PortBundleRef> *)&ref_generator);
    std::
    map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
    ::~map((map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
            *)&ref_port_ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void merge_bundle_mapping(
    const std::map<std::string, std::vector<std::pair<std::string, Generator*>>>& old_mapping) {
    for (auto const& [bundle_name, generators] : old_mapping) {
        std::map<Generator*, uint64_t> bundle_hashs;
        std::shared_ptr<PortBundleRef> ref_port_ref;
        Generator* ref_generator = nullptr;
        for (auto const& [entry_name, generator] : generators) {
            auto ref = generator->get_bundle_ref(entry_name);
            auto mappings = ref->name_mappings();
            std::vector<std::string> ports;
            ports.reserve(mappings.size());
            for (auto const& iter : mappings) {
                ports.emplace_back(iter.first);
            }
            std::sort(ports.begin(), ports.end());
            std::string base_str;
            for (auto const& port_name : ports) {
                auto port = generator->get_port(mappings.at(port_name));
                base_str.append(::format("{0}{1}{2}{3}", port->var_width(), port->width(),
                                         port->is_signed(), port_name));
            }
            uint64_t hash = hash_64_fnv1a(base_str.c_str(), base_str.size());
            if (bundle_hashs.find(generator) != bundle_hashs.end()) {
                if (bundle_hashs.at(generator) != hash)
                    throw UserException(::format(
                        "Port bundle with same name {0} have different definition", bundle_name));
            }
            bundle_hashs.emplace(generator, hash);

            ref_generator = generator;
            ref_port_ref = ref;
        }
        // for now we require the naming of the bundle has to be the same
        bool initialized = false;
        uint64_t base_hash = 0;
        for (auto const& iter : bundle_hashs) {
            uint64_t hash = iter.second;
            if (!initialized) {
                initialized = true;
                base_hash = hash;
            } else {
                if (base_hash != hash) {
                    throw UserException(::format(
                        "Port bundle with same name {0} have different definition", bundle_name));
                }
            }
        }
        if (!ref_generator) throw InternalException("ref generator cannot be null");
        // create a packed struct
        std::vector<std::tuple<std::string, uint32_t, bool>> def;
        auto const& mapping = ref_port_ref->name_mappings();
        for (auto const& [var_name, real_name] : mapping) {
            auto port = ref_generator->get_port(real_name);
            def.emplace_back(std::make_tuple(var_name, port->width(), port->is_signed()));
        }
        auto struct_ = std::make_shared<PackedStruct>(bundle_name, def);
        for (auto const& [entry_name, generator] : generators) {
            auto* p = dynamic_cast<Generator*>(generator->parent());
            // move sources around the ports
            auto ref = generator->get_bundle_ref(entry_name);
            auto const& m = ref->name_mappings();
            auto dir = generator->get_port(m.begin()->second)->port_direction();
            auto& packed = generator->port_packed(dir, entry_name, struct_);

            for (auto const& [attr, real_name] : m) {
                auto target = generator->get_port(real_name);
                auto& slice = packed[attr];
                if (dir != target->port_direction())
                    throw InternalException("Direction doesn't match");
                // depends on the direction, the parent can change;
                if (dir == PortDirection::In) {
                    if (p) {
                        Var::move_src_to(target.get(), &slice, p, false);
                    }
                    Var::move_sink_to(target.get(), &slice, generator, false);
                } else {
                    Var::move_src_to(target.get(), &slice, generator, false);
                    if (p) {
                        Var::move_sink_to(target.get(), &slice, p, false);
                    }
                }
                // remove target
                generator->remove_port(real_name);
            }
            // remove bundle info
            generator->remove_bundle_port_ref(entry_name);
        }
    }
}